

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_hash.cpp
# Opt level: O1

void duckdb::TemplatedLoopCombineHash<true,unsigned_int>
               (Vector *input,Vector *hashes,SelectionVector *rsel,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  ulong uVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  ulong uVar9;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_70;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (hashes->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      uVar5 = (ulong)*(uint *)input->data * -0x2917014799a6026d;
      uVar5 = (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
      uVar5 = uVar5 >> 0x20 ^ uVar5;
    }
    else {
      uVar5 = 0xbf58476d1ce4e5b9;
    }
    uVar9 = *(ulong *)hashes->data;
    *(ulong *)hashes->data = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d ^ uVar5;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
    Vector::ToUnifiedFormat(input,count,&local_70);
    if (hashes->vector_type == CONSTANT_VECTOR) {
      uVar5 = *(ulong *)hashes->data;
      Vector::SetVectorType(hashes,FLAT_VECTOR);
      pdVar2 = hashes->data;
      if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          psVar3 = rsel->sel_vector;
          psVar4 = (local_70.sel)->sel_vector;
          iVar8 = 0;
          do {
            iVar6 = iVar8;
            if (psVar3 != (sel_t *)0x0) {
              iVar6 = (idx_t)psVar3[iVar8];
            }
            iVar7 = iVar6;
            if (psVar4 != (sel_t *)0x0) {
              iVar7 = (idx_t)psVar4[iVar6];
            }
            uVar9 = ((ulong)*(uint *)(local_70.data + iVar7 * 4) * -0x2917014799a6026d >> 0x20 ^
                    (ulong)*(uint *)(local_70.data + iVar7 * 4) * -0x2917014799a6026d) *
                    -0x2917014799a6026d;
            *(ulong *)(pdVar2 + iVar6 * 8) =
                 uVar9 >> 0x20 ^ (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d ^ uVar9;
            iVar8 = iVar8 + 1;
          } while (count != iVar8);
        }
      }
      else if (count != 0) {
        psVar3 = rsel->sel_vector;
        psVar4 = (local_70.sel)->sel_vector;
        iVar8 = 0;
        do {
          iVar6 = iVar8;
          if (psVar3 != (sel_t *)0x0) {
            iVar6 = (idx_t)psVar3[iVar8];
          }
          iVar7 = iVar6;
          if (psVar4 != (sel_t *)0x0) {
            iVar7 = (idx_t)psVar4[iVar6];
          }
          uVar9 = 0xbf58476d1ce4e5b9;
          if ((local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0) {
            uVar9 = ((ulong)*(uint *)(local_70.data + iVar7 * 4) * -0x2917014799a6026d >> 0x20 ^
                    (ulong)*(uint *)(local_70.data + iVar7 * 4) * -0x2917014799a6026d) *
                    -0x2917014799a6026d;
            uVar9 = uVar9 >> 0x20 ^ uVar9;
          }
          *(ulong *)(pdVar2 + iVar6 * 8) = uVar9 ^ (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
      }
    }
    else {
      pdVar2 = hashes->data;
      if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          psVar3 = rsel->sel_vector;
          psVar4 = (local_70.sel)->sel_vector;
          iVar8 = 0;
          do {
            iVar6 = iVar8;
            if (psVar3 != (sel_t *)0x0) {
              iVar6 = (idx_t)psVar3[iVar8];
            }
            iVar7 = iVar6;
            if (psVar4 != (sel_t *)0x0) {
              iVar7 = (idx_t)psVar4[iVar6];
            }
            uVar5 = ((ulong)*(uint *)(local_70.data + iVar7 * 4) * -0x2917014799a6026d >> 0x20 ^
                    (ulong)*(uint *)(local_70.data + iVar7 * 4) * -0x2917014799a6026d) *
                    -0x2917014799a6026d;
            *(ulong *)(pdVar2 + iVar6 * 8) =
                 uVar5 >> 0x20 ^
                 (*(ulong *)(pdVar2 + iVar6 * 8) >> 0x20 ^ *(ulong *)(pdVar2 + iVar6 * 8)) *
                 -0x2917014799a6026d ^ uVar5;
            iVar8 = iVar8 + 1;
          } while (count != iVar8);
        }
      }
      else if (count != 0) {
        psVar3 = rsel->sel_vector;
        psVar4 = (local_70.sel)->sel_vector;
        iVar8 = 0;
        do {
          iVar6 = iVar8;
          if (psVar3 != (sel_t *)0x0) {
            iVar6 = (idx_t)psVar3[iVar8];
          }
          iVar7 = iVar6;
          if (psVar4 != (sel_t *)0x0) {
            iVar7 = (idx_t)psVar4[iVar6];
          }
          uVar5 = 0xbf58476d1ce4e5b9;
          if ((local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0) {
            uVar5 = ((ulong)*(uint *)(local_70.data + iVar7 * 4) * -0x2917014799a6026d >> 0x20 ^
                    (ulong)*(uint *)(local_70.data + iVar7 * 4) * -0x2917014799a6026d) *
                    -0x2917014799a6026d;
            uVar5 = uVar5 >> 0x20 ^ uVar5;
          }
          *(ulong *)(pdVar2 + iVar6 * 8) =
               (*(ulong *)(pdVar2 + iVar6 * 8) >> 0x20 ^ *(ulong *)(pdVar2 + iVar6 * 8)) *
               -0x2917014799a6026d ^ uVar5;
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
      }
    }
    if (local_70.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void TemplatedLoopCombineHash(Vector &input, Vector &hashes, const SelectionVector *rsel, idx_t count) {
	if (input.GetVectorType() == VectorType::CONSTANT_VECTOR && hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto ldata = ConstantVector::GetData<T>(input);
		auto hash_data = ConstantVector::GetData<hash_t>(hashes);

		auto other_hash = HashOp::Operation(*ldata, ConstantVector::IsNull(input));
		*hash_data = CombineHashScalar(*hash_data, other_hash);
	} else {
		UnifiedVectorFormat idata;
		input.ToUnifiedFormat(count, idata);
		if (hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			// mix constant with non-constant, first get the constant value
			auto constant_hash = *ConstantVector::GetData<hash_t>(hashes);
			// now re-initialize the hashes vector to an empty flat vector
			hashes.SetVectorType(VectorType::FLAT_VECTOR);
			TightLoopCombineHashConstant<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata), constant_hash,
			                                          FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                          idata.validity);
		} else {
			D_ASSERT(hashes.GetVectorType() == VectorType::FLAT_VECTOR);
			TightLoopCombineHash<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata),
			                                  FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                  idata.validity);
		}
	}
}